

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.c
# Opt level: O2

void test_deflate(Byte *compr,uLong comprLen)

{
  uint uVar1;
  size_t sVar2;
  char *pcVar3;
  char *local_a0;
  undefined4 local_98;
  long local_90;
  Byte *local_88;
  undefined4 local_80;
  ulong local_78;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  
  sVar2 = strlen(hello);
  local_60 = 0;
  uStack_58 = 0;
  local_50 = 0;
  uVar1 = deflateInit_(&local_a0,0xffffffffffffffff,"1.2.8",0x70);
  if (uVar1 != 0) {
    pcVar3 = "deflateInit";
    goto LAB_0010283e;
  }
  local_a0 = hello;
  local_88 = compr;
  do {
    if ((local_90 == sVar2 + 1) || (comprLen <= local_78)) goto LAB_001027ec;
    local_98 = 1;
    local_80 = local_98;
    uVar1 = deflate(&local_a0,0);
  } while (uVar1 == 0);
  goto LAB_00102826;
LAB_001027ec:
  do {
    local_80 = 1;
    uVar1 = deflate(&local_a0,4);
  } while (uVar1 == 0);
  if (uVar1 == 1) {
    uVar1 = deflateEnd(&local_a0);
    if (uVar1 == 0) {
      return;
    }
    pcVar3 = "deflateEnd";
    goto LAB_0010283e;
  }
LAB_00102826:
  pcVar3 = "deflate";
LAB_0010283e:
  fprintf(_stderr,"%s error: %d\n",pcVar3,(ulong)uVar1);
  exit(1);
}

Assistant:

void test_deflate(compr, comprLen)
    Byte *compr;
    uLong comprLen;
{
    z_stream c_stream; /* compression stream */
    int err;
    uLong len = (uLong)strlen(hello)+1;

    c_stream.zalloc = zalloc;
    c_stream.zfree = zfree;
    c_stream.opaque = (voidpf)0;

    err = deflateInit(&c_stream, Z_DEFAULT_COMPRESSION);
    CHECK_ERR(err, "deflateInit");

    c_stream.next_in  = (z_const unsigned char *)hello;
    c_stream.next_out = compr;

    while (c_stream.total_in != len && c_stream.total_out < comprLen) {
        c_stream.avail_in = c_stream.avail_out = 1; /* force small buffers */
        err = deflate(&c_stream, Z_NO_FLUSH);
        CHECK_ERR(err, "deflate");
    }
    /* Finish the stream, still forcing small buffers: */
    for (;;) {
        c_stream.avail_out = 1;
        err = deflate(&c_stream, Z_FINISH);
        if (err == Z_STREAM_END) break;
        CHECK_ERR(err, "deflate");
    }

    err = deflateEnd(&c_stream);
    CHECK_ERR(err, "deflateEnd");
}